

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

void __thiscall
dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>>::emplace<dg::vr::Bucket&>
          (VectorSet<std::reference_wrapper<dg::vr::Bucket>> *this,Bucket *vals)

{
  iterator __position;
  __normal_iterator<const_std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  _Var1;
  reference_wrapper<dg::vr::Bucket> val;
  reference_wrapper<dg::vr::Bucket> local_10;
  
  local_10._M_data = vals;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>const*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::reference_wrapper<dg::vr::Bucket>const>>
                    (*(undefined8 *)this,*(undefined8 *)(this + 8));
  __position._M_current = *(reference_wrapper<dg::vr::Bucket> **)(this + 8);
  if (_Var1._M_current == __position._M_current) {
    if (_Var1._M_current == *(reference_wrapper<dg::vr::Bucket> **)(this + 0x10)) {
      std::
      vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
      ::_M_realloc_insert<std::reference_wrapper<dg::vr::Bucket>>
                ((vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
                  *)this,__position,&local_10);
    }
    else {
      (__position._M_current)->_M_data = local_10._M_data;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
  }
  return;
}

Assistant:

void emplace(S &&...vals) {
        T val(std::forward<S>(vals)...);
        if (!contains(val))
            vec.emplace_back(std::move(val));
    }